

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O1

double computeTN93(char *s1,char *s2,unsigned_long L,char matchMode,long *randomize,long min_overlap
                  ,unsigned_long *histogram,double slice,unsigned_long hist_size,long count1,
                  long count2,sequence_gap_structure *sequence_descriptor1,
                  sequence_gap_structure *sequence_descriptor2)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  double (*padVar17) [4];
  long (*palVar18) [4];
  bool bVar19;
  double dVar20;
  double dVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  char *in_XMM9_Qa;
  double in_XMM9_Qb;
  anon_class_32_4_32a09f7f ambiguityHandler;
  double nucFreq [4];
  unsigned_long ambig_count;
  double nucF [4];
  long integer_counts2 [4] [4];
  long integer_counts [4] [4];
  double float_counts [4] [4];
  long alStackY_15b8 [16];
  long alStackY_1538 [590];
  byte local_289;
  double local_288;
  double local_280;
  undefined1 local_278 [16];
  char *local_268;
  double dStack_260;
  double local_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  anon_class_32_4_32a09f7f local_228;
  double local_208 [4];
  long local_1e8;
  unsigned_long local_1e0;
  double local_1d8 [4];
  long local_1b8 [32];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  double dStack_90;
  undefined8 local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  double dStack_50;
  undefined8 local_48;
  double dStack_40;
  
  local_289 = matchMode;
  local_1e0 = 0;
  local_208[2] = 0.0;
  local_208[3] = 0.0;
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  padVar17 = (double (*) [4])&local_b8;
  local_48 = 0;
  dStack_40 = 0.0;
  local_58 = 0;
  dStack_50 = 0.0;
  local_68 = 0.0;
  uStack_60 = 0;
  local_78 = 0.0;
  uStack_70 = 0;
  local_88 = 0;
  dStack_80 = 0.0;
  local_98 = 0;
  dStack_90 = 0.0;
  local_a8 = 0.0;
  uStack_a0 = 0;
  local_b8 = 0.0;
  uStack_b0 = 0;
  palVar18 = (long (*) [4])(local_1b8 + 0x10);
  local_1b8[0x1e] = 0;
  local_1b8[0x1f] = 0;
  local_1b8[0x1c] = 0;
  local_1b8[0x1d] = 0;
  local_1b8[0x1a] = 0;
  local_1b8[0x1b] = 0;
  local_1b8[0x18] = 0;
  local_1b8[0x19] = 0;
  local_1b8[0x16] = 0;
  local_1b8[0x17] = 0;
  local_1b8[0x14] = 0;
  local_1b8[0x15] = 0;
  local_1b8[0x12] = 0;
  local_1b8[0x13] = 0;
  local_1b8[0x10] = 0;
  local_1b8[0x11] = 0;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_228.matchMode = (char *)&local_289;
  local_228.ambig_count = &local_1e0;
  local_228.integer_counts = (long (*) [4] [4])palVar18;
  local_228.float_counts = (double (*) [4] [4])padVar17;
  if (randomize == (long *)0x0) {
    if (((matchMode == '\x03') || (sequence_descriptor1 == (sequence_gap_structure *)0x0)) ||
       (sequence_descriptor2 == (sequence_gap_structure *)0x0)) {
      if (L != 0) {
        dVar20 = 0.0;
        dVar21 = 4.94065645841247e-324;
        do {
          cVar1 = s1[(long)dVar20];
          uVar14 = (uint)cVar1;
          bVar2 = s2[(long)dVar20];
          uVar11 = (uint)(char)bVar2;
          if ((uVar14 < 4) && (bVar2 < 4)) {
            local_1b8[(ulong)uVar14 * 4 + (ulong)uVar11 + 0x10] =
                 local_1b8[(ulong)uVar14 * 4 + (ulong)uVar11 + 0x10] + 1;
          }
          else {
            if (bVar2 == 0x11 || cVar1 == '\x11') {
              if ((local_289 != 3) || (cVar1 == '\x11' && bVar2 == 0x11)) goto LAB_001047dd;
              if (cVar1 == '\x11') {
                uVar14 = 0xf;
              }
              else {
                uVar11 = 0xf;
              }
            }
            local_248._0_8_ = randomize;
            local_278._0_8_ = s1;
            local_288 = slice;
            local_280 = (double)L;
            local_268 = s2;
            computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar14,uVar11);
            s1 = (char *)local_278._0_8_;
            randomize = (long *)local_248._0_8_;
            L = (unsigned_long)local_280;
            s2 = local_268;
            slice = local_288;
          }
LAB_001047dd:
          bVar19 = (ulong)dVar21 < L;
          dVar20 = dVar21;
          dVar21 = (double)(ulong)(SUB84(dVar21,0) + 1);
        } while (bVar19);
      }
    }
    else {
      uVar13 = sequence_descriptor2->first_nongap;
      if (sequence_descriptor2->first_nongap < sequence_descriptor1->first_nongap) {
        uVar13 = sequence_descriptor1->first_nongap;
      }
      dVar20 = (double)sequence_descriptor2->last_nongap;
      if (sequence_descriptor1->last_nongap < sequence_descriptor2->last_nongap) {
        dVar20 = (double)sequence_descriptor1->last_nongap;
      }
      uVar8 = sequence_descriptor2->resolved_start;
      if (sequence_descriptor2->resolved_start < sequence_descriptor1->resolved_start) {
        uVar8 = sequence_descriptor1->resolved_start;
      }
      uVar15 = sequence_descriptor2->resolved_end;
      if (sequence_descriptor1->resolved_end < sequence_descriptor2->resolved_end) {
        uVar15 = sequence_descriptor1->resolved_end;
      }
      if (uVar15 < uVar8) {
        uVar11 = (uint)uVar13;
        dVar21 = (double)(uVar13 & 0xffffffff);
        if ((ulong)dVar21 <= (ulong)dVar20) {
          local_288 = slice;
          local_268 = s2;
          local_278._0_8_ = s1;
          local_250 = dVar20;
          do {
            uVar11 = uVar11 + 1;
            uVar14 = (uint)s1[(long)dVar21];
            bVar2 = s2[(long)dVar21];
            if (bVar2 < 4 && uVar14 < 4) {
              local_1b8[(ulong)uVar14 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] =
                   local_1b8[(ulong)uVar14 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] + 1;
            }
            else if (bVar2 != 0x11 && s1[(long)dVar21] != '\x11') {
              computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar14,(int)(char)bVar2);
              dVar20 = local_250;
              s1 = (char *)local_278._0_8_;
              s2 = local_268;
              slice = local_288;
            }
            dVar21 = (double)(ulong)uVar11;
          } while ((ulong)dVar21 <= (ulong)dVar20);
        }
      }
      else {
        local_250 = dVar20;
        uVar16 = uVar13 + 2;
        while( true ) {
          if (uVar8 < uVar16) break;
          uVar11 = (uint)s1[uVar13];
          bVar2 = s2[uVar13];
          bVar3 = s1[uVar13 + 1];
          uVar16 = (ulong)local_238 >> 0x20;
          local_238 = (double)CONCAT44((int)uVar16,(int)s2[uVar13 + 1]);
          if ((uVar11 < 4) && (bVar2 < 4)) {
            local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] =
                 local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar13] != '\x11') {
            local_278._0_8_ = s1;
            local_248._0_8_ = randomize;
            local_288 = slice;
            local_280 = (double)L;
            local_268 = s2;
            local_1e8 = min_overlap;
            computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar11,(int)(char)bVar2);
            s1 = (char *)local_278._0_8_;
            randomize = (long *)local_248._0_8_;
            min_overlap = local_1e8;
            L = (unsigned_long)local_280;
            s2 = local_268;
            slice = local_288;
          }
          if ((bVar3 < 4) && (SUB81(local_238,0) < 4)) {
            local_1b8[(ulong)(uint)(int)(char)bVar3 * 4 + ((ulong)local_238 & 0xffffffff)] =
                 local_1b8[(ulong)(uint)(int)(char)bVar3 * 4 + ((ulong)local_238 & 0xffffffff)] + 1;
          }
          else if ((bVar3 != 0x11) && (SUB81(local_238,0) != 0x11)) {
            local_278._0_8_ = s1;
            local_248._0_8_ = randomize;
            local_288 = slice;
            local_280 = (double)L;
            local_268 = s2;
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&local_228,(int)(char)bVar3,(uint)local_238);
            s1 = (char *)local_278._0_8_;
            randomize = (long *)local_248._0_8_;
            L = (unsigned_long)local_280;
            s2 = local_268;
            slice = local_288;
          }
          uVar16 = uVar13 + 4;
          uVar13 = uVar13 + 2;
        }
        if (uVar13 < uVar8) {
          uVar11 = (uint)s1[uVar13];
          bVar2 = s2[uVar13];
          if ((uVar11 < 4) && (bVar2 < 4)) {
            local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] =
                 local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar13] != '\x11') {
            local_278._0_8_ = s1;
            local_248._0_8_ = randomize;
            local_288 = slice;
            local_268 = s2;
            computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar11,(int)(char)bVar2);
            s1 = (char *)local_278._0_8_;
            randomize = (long *)local_248._0_8_;
            s2 = local_268;
            slice = local_288;
          }
        }
        uVar13 = uVar8 + 2;
        dVar20 = local_250;
        while (local_250 = dVar20, uVar13 <= uVar15) {
          local_1b8[(long)s1[uVar8] * 4 + (long)s2[uVar8] + 0x10] =
               local_1b8[(long)s1[uVar8] * 4 + (long)s2[uVar8] + 0x10] + 1;
          local_1b8[(long)s1[uVar8 + 1] * 4 + (long)s2[uVar8 + 1]] =
               local_1b8[(long)s1[uVar8 + 1] * 4 + (long)s2[uVar8 + 1]] + 1;
          uVar13 = uVar8 + 4;
          uVar8 = uVar8 + 2;
          dVar20 = local_250;
        }
        for (; uVar8 <= uVar15; uVar8 = uVar8 + 1) {
          local_1b8[(ulong)(uint)(int)s1[uVar8] * 4 + (ulong)(uint)(int)s2[uVar8] + 0x10] =
               local_1b8[(ulong)(uint)(int)s1[uVar8] * 4 + (ulong)(uint)(int)s2[uVar8] + 0x10] + 1;
        }
        dVar21 = (double)(uVar15 + 1);
        if ((ulong)dVar21 <= (ulong)dVar20) {
          do {
            uVar11 = (uint)s1[(long)dVar21];
            bVar2 = s2[(long)dVar21];
            if ((uVar11 < 4) && (bVar2 < 4)) {
              local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] =
                   local_1b8[(ulong)uVar11 * 4 + (ulong)(uint)(int)(char)bVar2 + 0x10] + 1;
            }
            else if (bVar2 != 0x11 && s1[(long)dVar21] != '\x11') {
              local_278._0_8_ = s1;
              local_248._0_8_ = randomize;
              local_288 = slice;
              local_268 = s2;
              computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar11,(int)(char)bVar2);
              dVar20 = local_250;
              s1 = (char *)local_278._0_8_;
              randomize = (long *)local_248._0_8_;
              s2 = local_268;
              slice = local_288;
            }
            dVar21 = (double)((long)dVar21 + 1);
          } while ((ulong)dVar21 <= (ulong)dVar20);
        }
      }
    }
  }
  else if (L != 0) {
    dVar20 = 0.0;
    dVar21 = 4.94065645841247e-324;
    do {
      cVar1 = s1[randomize[(long)dVar20]];
      uVar14 = (uint)cVar1;
      bVar2 = s2[randomize[(long)dVar20]];
      uVar11 = (uint)(char)bVar2;
      if ((uVar14 < 4) && (bVar2 < 4)) {
        local_1b8[(ulong)uVar14 * 4 + (ulong)uVar11 + 0x10] =
             local_1b8[(ulong)uVar14 * 4 + (ulong)uVar11 + 0x10] + 1;
      }
      else {
        if (bVar2 == 0x11 || cVar1 == '\x11') {
          if ((local_289 != 3) || (cVar1 == '\x11' && bVar2 == 0x11)) goto LAB_001045c1;
          if (cVar1 == '\x11') {
            uVar14 = 0xf;
          }
          else {
            uVar11 = 0xf;
          }
        }
        local_248._0_8_ = randomize;
        local_278._0_8_ = s1;
        local_288 = slice;
        local_280 = (double)L;
        local_268 = s2;
        computeTN93::anon_class_32_4_32a09f7f::operator()(&local_228,uVar14,uVar11);
        s1 = (char *)local_278._0_8_;
        randomize = (long *)local_248._0_8_;
        L = (unsigned_long)local_280;
        s2 = local_268;
        slice = local_288;
      }
LAB_001045c1:
      bVar19 = (ulong)dVar21 < L;
      dVar20 = dVar21;
      dVar21 = (double)(ulong)(SUB84(dVar21,0) + 1);
    } while (bVar19);
  }
  dVar20 = 0.0;
  plVar9 = local_1b8;
  lVar10 = 0;
  do {
    lVar12 = 0;
    do {
      dVar21 = (double)(plVar9[lVar12] + (*(long (*) [4])*palVar18)[lVar12]) +
               (*(double (*) [4])*padVar17)[lVar12];
      (*(double (*) [4])*padVar17)[lVar12] = dVar21;
      dVar20 = dVar20 + dVar21;
      local_208[lVar10] = local_208[lVar10] + dVar21;
      local_208[lVar12] = dVar21 + local_208[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar10 = lVar10 + 1;
    palVar18 = palVar18 + 1;
    plVar9 = plVar9 + 4;
    padVar17 = padVar17 + 1;
  } while (lVar10 != 4);
  if (dVar20 <= (double)min_overlap) {
    dVar20 = -1.0;
  }
  else if ((((local_289 & 0xfb) != 0) || (1.0 <= resolve_fraction)) ||
          (auVar27._0_8_ = (double)CONCAT44(0x43300000,(int)local_1e0),
          auVar27._8_4_ = (int)(local_1e0 >> 0x20), auVar27._12_4_ = 0x45300000,
          (auVar27._8_8_ - 1.9342813113834067e+25) + (auVar27._0_8_ - 4503599627370496.0) <
          dVar20 * resolve_fraction)) {
    dVar20 = local_208[3] + local_208[1] + local_208[0] + local_208[2];
    dVar21 = 1.0 / dVar20;
    lVar10 = 0;
    do {
      dVar5 = local_208[lVar10 + 1];
      local_1d8[lVar10] = local_208[lVar10] * dVar21;
      local_1d8[lVar10 + 1] = dVar5 * dVar21;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 4);
    dVar20 = 2.0 / dVar20;
    dVar21 = local_1d8[0] + local_1d8[2];
    dVar5 = local_1d8[1] + local_1d8[3];
    auVar27 = ZEXT816(0);
    auVar23._4_4_ = -(uint)(local_208[1] == 0.0);
    auVar23._0_4_ = -(uint)(local_208[0] == 0.0);
    auVar23._8_4_ = -(uint)(local_208[2] == 0.0);
    auVar23._12_4_ = -(uint)(local_208[3] == 0.0);
    iVar7 = movmskps(4,auVar23);
    if (iVar7 == 0) {
      auVar26._0_8_ = (local_1d8[0] + local_1d8[0]) * local_1d8[2];
      auVar26._8_8_ = (local_1d8[1] + local_1d8[1]) * local_1d8[3];
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = dVar21;
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      auVar27 = divpd(auVar26,auVar4);
      dVar24 = (dVar21 * dVar5 - (local_1d8[2] * local_1d8[0] * dVar5) / dVar21) -
               (local_1d8[1] * local_1d8[3] * dVar21) / dVar5;
      in_XMM9_Qa = (char *)(dVar24 + dVar24);
      in_XMM9_Qb = dVar5;
    }
    dVar24 = (local_a8 + local_78) * dVar20;
    auVar22._0_8_ = (dStack_80 + dStack_50) * dVar20;
    dVar20 = 1.0 - ((local_b8 + dStack_90 + local_68 + dStack_40) * dVar20 + dVar24 + auVar22._0_8_)
    ;
    if ((char)iVar7 == '\0') {
      dVar24 = (1.0 - dVar24 / auVar27._0_8_) - (dVar20 * 0.5) / dVar21;
      dVar25 = 1000.0;
      uStack_230 = 0;
      if (0.0 < dVar24) {
        auVar22._8_8_ = dVar20 * 0.5;
        auVar6._8_8_ = dVar5;
        auVar6._0_8_ = auVar27._8_8_;
        auVar23 = divpd(auVar22,auVar6);
        dVar20 = (1.0 - auVar23._0_8_) - auVar23._8_8_;
        if ((0.0 < dVar20) && (dVar21 = 1.0 - auVar23._8_8_ / dVar21, 0.0 < dVar21)) {
          local_278._8_4_ = auVar27._8_4_;
          local_278._0_8_ = -auVar27._0_8_;
          local_278._12_4_ = auVar27._12_4_ ^ 0x80000000;
          local_288 = slice;
          local_280 = dVar20;
          local_268 = in_XMM9_Qa;
          dStack_260 = in_XMM9_Qb;
          local_250 = dVar21;
          local_248 = auVar27;
          local_238 = log(dVar24);
          uStack_230 = extraout_XMM0_Qb_00;
          dVar20 = log(local_280);
          local_238 = local_238 * (double)local_278._0_8_ - (double)local_248._8_8_ * dVar20;
          dVar20 = log(local_250);
          dVar25 = local_238 - (double)local_268 * dVar20;
          slice = local_288;
        }
      }
    }
    else {
      dVar21 = (1.0 - (dVar24 + auVar22._0_8_ + dVar24 + auVar22._0_8_)) - dVar20;
      dVar25 = 1000.0;
      uStack_230 = 0;
      if ((0.0 < dVar21) && (dVar20 = 1.0 - (dVar20 + dVar20), 0.0 < dVar20)) {
        local_288 = slice;
        local_250 = dVar20;
        local_238 = log(dVar21);
        uStack_230 = extraout_XMM0_Qb;
        dVar20 = log(local_250);
        dVar25 = local_238 * -0.5 + dVar20 * -0.25;
        slice = local_288;
      }
    }
    local_238 = dVar25;
    if (histogram != (unsigned_long *)0x0) {
      dVar20 = floor(slice * dVar25);
      uVar13 = hist_size - 1;
      if ((ulong)(long)dVar20 < hist_size) {
        uVar13 = (long)dVar20;
      }
      histogram[uVar13] = histogram[uVar13] + count2 * count1;
    }
    dVar20 = (double)(~-(ulong)(local_238 <= 0.0) & (ulong)local_238);
  }
  else {
    dVar20 = computeTN93(s1,s2,L,'\x01',randomize,min_overlap,histogram,slice,hist_size,count1,
                         count2,(sequence_gap_structure *)0x0,(sequence_gap_structure *)0x0);
  }
  return dVar20;
}

Assistant:

double		computeTN93 (const char * __restrict__ s1, const char * __restrict__ s2,  const unsigned long L, const char matchMode, const long * randomize, const long min_overlap,
                       unsigned long* histogram, const double slice, const unsigned long hist_size, const long count1, const long count2, const sequence_gap_structure * sequence_descriptor1, const sequence_gap_structure * sequence_descriptor2) {
  
  bool useK2P   = false;
  unsigned long ambig_count = 0UL;
  long aux1;
    
  
  double auxd,
  nucFreq[4]		= {0.,0.,0.,0.},
  fY,
  fR,
  K1,
  K2,
  K3,
  AG,
  CT,
  ti,
  tv,
  totalNonGap	= 0.,
  nucF[4],
  float_counts [4][4] = {{0.},{0.},{0.},{0.}};
  
  long integer_counts  [4][4] = {{0L}, {0L}, {0L}, {0L}};
  long integer_counts2 [4][4] = {{0L}, {0L}, {0L}, {0L}};

  auto ambiguityHandler = [&] (unsigned c1, unsigned c2) -> void {
      if (c1 < 4UL) { // c1 resolved and c2 is not
        if (matchMode != SKIP) {
          if (resolutionsCount[c2] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c2])) {
                  if (resolutions[c2][c1]) {
                      ambig_count ++;
                      integer_counts[c1][c1] ++;
                      return;
                  }
              }
            
            if (resolutions[c2][0])
              float_counts[c1][0] += resolutionsCount[c2];
            if (resolutions[c2][1])
              float_counts[c1][1] += resolutionsCount[c2];
            if (resolutions[c2][2])
              float_counts[c1][2] += resolutionsCount[c2];
            if (resolutions[c2][3])
              float_counts[c1][3] += resolutionsCount[c2];
          }
        }
      }
      else {
        if (matchMode != SKIP) {
          if (c2 < 4UL) { // c2 resolved an c1 is not
            if (resolutionsCount[c1] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1])) {
                if (resolutions[c1][c2]) {
                  ambig_count ++;
                  integer_counts[c2][c2] ++;
                    return;
                }
              }
              
                
              if (resolutions[c1][0])
                float_counts[0][c2] += resolutionsCount[c1];
              if (resolutions[c1][1])
                float_counts[1][c2] += resolutionsCount[c1];
              if (resolutions[c1][2])
                float_counts[2][c2] += resolutionsCount[c1];
              if (resolutions[c1][3])
                float_counts[3][c2] += resolutionsCount[c1];
            }
          } else {
            // ambig and ambig
            double norm = resolutionsCount[c1] * resolutionsCount[c2];
            //cout << int(c1) << ":" << int(c2) << "/" << norm << endl;
            if (norm > 0.0) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1] && resolveTheseAmbigs[c2])) {
                ambig_count ++;
                long matched_count = 0L,
                positive_match [4] = {0,0,0,0};
                for (long i = 0; i < 4L; i ++) {
                  if (resolutions[c1][i] && resolutions[c2][i]) {
                    matched_count ++;
                    positive_match[i] = 1;
                  }
                }
                
                if (matched_count > 0L) {
                  double norm2 = 1./matched_count;
                  
                  for (long i = 0; i < 4L; i ++) {
                    if (positive_match[i]) {
                      float_counts[i][i] += norm2;
                    }
                  }
                    return;
                }
              }
              
              for (long i = 0; i < 4L; i ++) {
                if (resolutions[c1][i]) {
                  for (long j = 0; j < 4L; j ++) {
                    if (resolutions [c2][j]) {
                      float_counts[i][j] += norm;
                    }
                  }
                }
              }
            }
          }
        }
      }
  };

  if (randomize == NULL) {
    
    if (sequence_descriptor1 && sequence_descriptor2 && matchMode != GAPMM) {
      
      
//#pragma omp critical      
//      cout << "HERE" << endl;
     
      
      unsigned long first_nongap = MAX  (sequence_descriptor1->first_nongap,   sequence_descriptor2->first_nongap),
                    last_nongap  = MIN  (sequence_descriptor1->last_nongap,    sequence_descriptor2->last_nongap),
                    span_start   = MAX  (sequence_descriptor1->resolved_start, sequence_descriptor2->resolved_start),
                    span_end     = MIN  (sequence_descriptor1->resolved_end,    sequence_descriptor2->resolved_end);
//#pragma omp critical      
//      cout << first_nongap << " " << last_nongap << " " << span_start << " " << span_end << endl;
      
      
      if (span_start > span_end) {
        for (unsigned p = first_nongap; p <= last_nongap; p++) {
          unsigned c1 = s1[p],
                   c2 = s2[p];
          
          if (c1 < 4 && c2 < 4) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
      else {
        
        /*for (unsigned long p = first_nongap; p < span_start; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }*/
        unsigned long p = first_nongap;
          
        for (; p + 2 <= span_start; p+=2) {
            unsigned c1 = s1[p],   c2 = s2[p];
            unsigned c3 = s1[p+1], c4 = s2[p+1];
            
            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                ambiguityHandler (c1,c2);
              }
            }
            
            if (__builtin_expect(c3 < 4 && c4 < 4, 1)) {
              integer_counts2 [c3][c4] ++;
            } else { // not both resolved
              if (c3 != GAP && c4 != GAP) {
                ambiguityHandler (c3,c4);
              }
            }
        }
          
        if (p < span_start) {
            unsigned c1 = s1[p];
            unsigned c2 = s2[p];

            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                  ambiguityHandler (c1,c2);
              }
            }
          
        }
        
        // manual loop unroll here, use integer table counts
          
        //long equals [4] = {0L,0L,0L,0L};
          
          p  = span_start;
          for (; p + 2 <= span_end ; p+=2) {
              integer_counts  [s1[p]]   [s2[p]]   ++;
              integer_counts2 [s1[p+1]] [s2[p+1]] ++;
          }
              
          for (; p <= span_end ; p++) {
           integer_counts [(unsigned)s1[p]][(unsigned)s2[p]] ++;
         }

        /*for (unsigned long p = span_start; p <= span_end ; p++) {
            unsigned  idx1 = ((unsigned)s1[p]);
            unsigned  idx2 = ((unsigned)s2[p]);
            integer_counts [idx1][idx2] ++;
        }*/
          
        for (unsigned long p = span_end + 1UL; p <= last_nongap; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
 
          if (__builtin_expect(c1 < 4UL && c2 < 4UL,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
    } else {
        for (unsigned p = 0; p < L; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
    }
  } else {
        for (unsigned p = 0; p < L; p++) {
          long pi = randomize[p];
          unsigned c1 = s1[pi], c2 = s2[pi];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
  }
  
  
  //printf ("\n");
  for (int c1 = 0; c1 < 4; c1++) {
    //printf ("\n");
    for (int c2 = 0; c2 < 4; c2++) {
      double pc = (float_counts[c1][c2] += (double)(integer_counts[c1][c2] + integer_counts2[c1][c2]));
      //printf ("%12.2g\t", pc);
      totalNonGap   += pc;
      nucFreq [c1]  += pc;
      nucFreq [c2]  += pc;
    }
  }
  //printf ("\ntotalNonGap = %g\n", totalNonGap);

  if (totalNonGap <= min_overlap) {
    return -1.;
  }
  
  if ((matchMode == RESOLVE || matchMode == SUBSET) && resolve_fraction < 1. && totalNonGap * resolve_fraction <= ambig_count) {
    //cout << ambig_count << "/" << totalNonGap << endl;
    return computeTN93 (s1, s2,  L, AVERAGE , randomize, min_overlap,
                       histogram, slice, hist_size, count1, count2);
  }
  
  totalNonGap = 2./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  
  auxd = 1./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  for (aux1 = 0; aux1 < 4; aux1++)
    nucF[aux1] = nucFreq[aux1]*auxd;
  
  fR = nucF[0]+nucF[2];
  fY = nucF[1]+nucF[3];
  
  if (nucFreq[0] == 0 || nucFreq[1] == 0 || nucFreq[2] == 0 || nucFreq[3] == 0) {
      useK2P = true;
  } else {
    K1 = 2.*nucF[0]*nucF[2]/fR;
    K2 = 2.*nucF[1]*nucF[3]/fY;
    K3 = 2.*(fR*fY - nucF[0]*nucF[2]*fY/fR - nucF[1]*nucF[3]*fR/fY);
  }
  
  AG = (float_counts[0][2] + float_counts[2][0] )*totalNonGap;
  CT = (float_counts[1][3] + float_counts[3][1])*totalNonGap;
  tv = 1.-((float_counts[0][0] + float_counts[1][1] + float_counts[2][2] + float_counts[3][3])*totalNonGap +
           AG+CT);
  
  
  double dist;
  
  
  if (useK2P) {
    ti = AG+CT;
    AG = 1.-2.*ti-tv;
    CT = 1.-2.*tv;
    if (AG > 0. && CT > 0.)
      dist = -0.5*log(AG)-0.25*log(CT);
    else  
      dist = TN93_MAX_DIST;
  } else {
    AG	= 1.-AG/K1 - 0.5*tv/fR;
    CT	= 1.-CT/K2 - 0.5*tv/fY;
    tv  = 1.-0.5 * tv/fY/fR;
    if (AG > 0. && CT > 0. && tv > 0)
      dist = - K1*log(AG) - K2*log(CT) - K3*log (tv);
    else
      dist = TN93_MAX_DIST;
  }
  
  if (histogram) {
    long index = floor(dist * slice);
    if (index >= hist_size) {
      index = hist_size - 1;
    }
    histogram[index] += count1 * count2;
  }
  
  return dist <= 0. ? 0. : dist; // this is to avoid returning -0
}